

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void notValidDate(char *attrName)

{
  ostream *poVar1;
  invalid_argument *this;
  string local_1c0 [32];
  stringstream e;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&e);
  poVar1 = std::operator<<(local_190,"The value for the ");
  poVar1 = std::operator<<(poVar1,attrName);
  std::operator<<(poVar1," attribute is not a valid date of the form \"YYYY:MM:DD yy:mm:ss\"");
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,local_1c0);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
notValidDate (const char attrName[])
{
    std::stringstream e;
    e << "The value for the " << attrName
      << " attribute is not a valid date of the form \"YYYY:MM:DD yy:mm:ss\"";
    throw invalid_argument(e.str());
}